

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

void parse_example_tweaks(options_i *options,vw *all)

{
  int iVar1;
  long *plVar2;
  byte bVar3;
  uint32_t uVar4;
  typed_option<unsigned_long> *label_list;
  vw *all_00;
  option_group_definition *funcName;
  ostream *poVar5;
  namedlabels *pnVar6;
  loss_function *plVar7;
  void *pvVar8;
  long *in_RSI;
  long *in_RDI;
  option_group_definition example_options;
  bool test_only;
  size_t early_terminate_passes;
  float loss_parameter;
  string loss_function;
  string named_labels;
  string *in_stack_ffffffffffffeaa8;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffeab0;
  string *in_stack_ffffffffffffeab8;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffeac0;
  byte local_1519;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffeaf8;
  option_group_definition *in_stack_ffffffffffffeb00;
  byte local_1472;
  allocator *paVar9;
  float function_parameter;
  namedlabels *this;
  allocator local_11f1;
  string local_11f0 [32];
  string local_11d0 [32];
  string local_11b0 [39];
  allocator local_1189;
  string local_1188 [37];
  byte local_1163;
  byte local_1162;
  allocator local_1161;
  string local_1160 [39];
  allocator local_1139;
  string local_1138 [39];
  allocator local_1111;
  string local_1110 [39];
  allocator local_10e9;
  string local_10e8 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10c8;
  allocator local_1021;
  string local_1020 [39];
  allocator local_ff9;
  string local_ff8 [199];
  allocator local_f31;
  string local_f30 [39];
  allocator local_f09;
  string local_f08 [199];
  allocator local_e41;
  string local_e40 [39];
  allocator local_e19;
  string local_e18 [199];
  allocator local_d51;
  string local_d50 [39];
  allocator local_d29;
  string local_d28 [199];
  allocator local_c61;
  string local_c60 [39];
  allocator local_c39;
  string local_c38 [39];
  allocator local_c11;
  string local_c10 [199];
  allocator local_b49;
  string local_b48 [39];
  allocator local_b21;
  string local_b20 [199];
  allocator local_a59;
  string local_a58 [39];
  allocator local_a31;
  string local_a30 [199];
  allocator local_969;
  string local_968 [39];
  allocator local_941;
  string local_940 [199];
  allocator local_879;
  string local_878 [39];
  allocator local_851;
  string local_850 [199];
  allocator local_789;
  string local_788 [39];
  allocator local_761;
  string local_760 [199];
  allocator local_699;
  string local_698 [39];
  allocator local_671;
  string local_670 [199];
  undefined1 local_5a9 [40];
  allocator local_581;
  string local_580 [199];
  allocator local_4b9;
  string local_4b8 [39];
  allocator local_491;
  string local_490 [199];
  allocator local_3c9;
  string local_3c8 [39];
  allocator local_3a1;
  string local_3a0 [199];
  allocator local_2d9;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [199];
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [215];
  allocator local_c1;
  string local_c0 [32];
  undefined1 local_a0 [63];
  byte local_61;
  undefined4 local_54;
  string local_50 [32];
  string local_30 [32];
  long *local_10;
  long *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  local_54 = 0;
  local_61 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"Example options",&local_c1);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"testonly",&local_199);
  VW::config::make_option<bool>(in_stack_ffffffffffffeab8,(bool *)in_stack_ffffffffffffeab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"t",&local_1c1);
  VW::config::typed_option<bool>::short_name
            ((typed_option<bool> *)in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"Ignore label information and just test",&local_1e9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffeb00,(typed_option<bool> *)in_stack_ffffffffffffeaf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"holdout_off",&local_2b1);
  VW::config::make_option<bool>(in_stack_ffffffffffffeab8,(bool *)in_stack_ffffffffffffeab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d8,"no holdout data in multiple passes",&local_2d9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffeb00,(typed_option<bool> *)in_stack_ffffffffffffeaf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a0,"holdout_period",&local_3a1);
  VW::config::make_option<unsigned_int>(in_stack_ffffffffffffeab8,(uint *)in_stack_ffffffffffffeab0)
  ;
  VW::config::typed_option<unsigned_int>::default_value
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffeac0,
             (uint)((ulong)in_stack_ffffffffffffeab8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c8,"holdout period for test only",&local_3c9);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (in_stack_ffffffffffffeb00,(typed_option<unsigned_int> *)in_stack_ffffffffffffeaf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_490,"holdout_after",&local_491);
  VW::config::make_option<unsigned_int>(in_stack_ffffffffffffeab8,(uint *)in_stack_ffffffffffffeab0)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4b8,"holdout after n training examples, default off (disables holdout_period)",
             &local_4b9);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (in_stack_ffffffffffffeb00,(typed_option<unsigned_int> *)in_stack_ffffffffffffeaf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_580,"early_terminate",&local_581);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffeab8,(unsigned_long *)in_stack_ffffffffffffeab0);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffeac0,
             (unsigned_long)in_stack_ffffffffffffeab8);
  this = (namedlabels *)local_5a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_5a9 + 1),
             "Specify the number of passes tolerated when holdout loss doesn\'t decrease before early termination"
             ,(allocator *)this);
  label_list = VW::config::typed_option<unsigned_long>::help
                         ((typed_option<unsigned_long> *)in_stack_ffffffffffffeab0,
                          in_stack_ffffffffffffeaa8);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_ffffffffffffeb00,(typed_option<unsigned_long> *)in_stack_ffffffffffffeaf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_670,"passes",&local_671);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffeab8,(unsigned_long *)in_stack_ffffffffffffeab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_698,"Number of Training Passes",&local_699);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_ffffffffffffeb00,(typed_option<unsigned_long> *)in_stack_ffffffffffffeaf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_760,"initial_pass_length",&local_761);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffeab8,(unsigned_long *)in_stack_ffffffffffffeab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_788,"initial number of examples per pass",&local_789);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_ffffffffffffeb00,(typed_option<unsigned_long> *)in_stack_ffffffffffffeaf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_850,"examples",&local_851);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffeab8,(unsigned_long *)in_stack_ffffffffffffeab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_878,"number of examples to parse",&local_879);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_ffffffffffffeb00,(typed_option<unsigned_long> *)in_stack_ffffffffffffeaf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_940,"min_prediction",&local_941);
  VW::config::make_option<float>(in_stack_ffffffffffffeab8,(float *)in_stack_ffffffffffffeab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_968,"Smallest prediction to output",&local_969);
  all_00 = (vw *)VW::config::typed_option<float>::help
                           ((typed_option<float> *)in_stack_ffffffffffffeab0,
                            in_stack_ffffffffffffeaa8);
  funcName = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                       (in_stack_ffffffffffffeb00,(typed_option<float> *)in_stack_ffffffffffffeaf8);
  paVar9 = &local_a31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a30,"max_prediction",paVar9);
  function_parameter = (float)((ulong)paVar9 >> 0x20);
  VW::config::make_option<float>(in_stack_ffffffffffffeab8,(float *)in_stack_ffffffffffffeab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a58,"Largest prediction to output",&local_a59);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_ffffffffffffeb00,(typed_option<float> *)in_stack_ffffffffffffeaf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b20,"sort_features",&local_b21);
  VW::config::make_option<bool>(in_stack_ffffffffffffeab8,(bool *)in_stack_ffffffffffffeab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b48,
             "turn this on to disregard order in which features have been defined. This will lead to smaller cache sizes"
             ,&local_b49);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffeb00,(typed_option<bool> *)in_stack_ffffffffffffeaf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c10,"loss_function",&local_c11);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffeab8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c38,"squared",&local_c39);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  default_value(in_stack_ffffffffffffeac0,in_stack_ffffffffffffeab8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c60,
             "Specify the loss function to be used, uses squared by default. Currently available ones are squared, classic, hinge, logistic, quantile and poisson."
             ,&local_c61);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d28,"quantile_tau",&local_d29);
  VW::config::make_option<float>(in_stack_ffffffffffffeab8,(float *)in_stack_ffffffffffffeab0);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)in_stack_ffffffffffffeac0,
             (float)((ulong)in_stack_ffffffffffffeab8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d50,"Parameter \\tau associated with Quantile loss. Defaults to 0.5",&local_d51);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_ffffffffffffeb00,(typed_option<float> *)in_stack_ffffffffffffeaf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e18,"l1",&local_e19);
  VW::config::make_option<float>(in_stack_ffffffffffffeab8,(float *)in_stack_ffffffffffffeab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e40,"l_1 lambda",&local_e41);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_ffffffffffffeb00,(typed_option<float> *)in_stack_ffffffffffffeaf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f08,"l2",&local_f09);
  VW::config::make_option<float>(in_stack_ffffffffffffeab8,(float *)in_stack_ffffffffffffeab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f30,"l_2 lambda",&local_f31);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_ffffffffffffeb00,(typed_option<float> *)in_stack_ffffffffffffeaf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ff8,"no_bias_regularization",&local_ff9);
  VW::config::make_option<bool>(in_stack_ffffffffffffeab8,(bool *)in_stack_ffffffffffffeab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1020,"no bias in regularization",&local_1021);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffeb00,(typed_option<bool> *)in_stack_ffffffffffffeaf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10e8,"named_labels",&local_10e9);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffeab8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeab0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(&local_10c8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1110,
             "use names for labels (multiclass, etc.) rather than integers, argument specified all possible labels, comma-sep, eg \"--named_labels Noun,Verb,Adj,Punc\""
             ,&local_1111);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8);
  std::__cxx11::string::~string(local_1110);
  std::allocator<char>::~allocator((allocator<char> *)&local_1111);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffeab0);
  std::__cxx11::string::~string(local_10e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_10e9);
  std::__cxx11::string::~string(local_1020);
  std::allocator<char>::~allocator((allocator<char> *)&local_1021);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffeab0);
  std::__cxx11::string::~string(local_ff8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ff9);
  std::__cxx11::string::~string(local_f30);
  std::allocator<char>::~allocator((allocator<char> *)&local_f31);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffeab0);
  std::__cxx11::string::~string(local_f08);
  std::allocator<char>::~allocator((allocator<char> *)&local_f09);
  std::__cxx11::string::~string(local_e40);
  std::allocator<char>::~allocator((allocator<char> *)&local_e41);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffeab0);
  std::__cxx11::string::~string(local_e18);
  std::allocator<char>::~allocator((allocator<char> *)&local_e19);
  std::__cxx11::string::~string(local_d50);
  std::allocator<char>::~allocator((allocator<char> *)&local_d51);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffeab0);
  std::__cxx11::string::~string(local_d28);
  std::allocator<char>::~allocator((allocator<char> *)&local_d29);
  std::__cxx11::string::~string(local_c60);
  std::allocator<char>::~allocator((allocator<char> *)&local_c61);
  std::__cxx11::string::~string(local_c38);
  std::allocator<char>::~allocator((allocator<char> *)&local_c39);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffeab0);
  std::__cxx11::string::~string(local_c10);
  std::allocator<char>::~allocator((allocator<char> *)&local_c11);
  std::__cxx11::string::~string(local_b48);
  std::allocator<char>::~allocator((allocator<char> *)&local_b49);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffeab0);
  std::__cxx11::string::~string(local_b20);
  std::allocator<char>::~allocator((allocator<char> *)&local_b21);
  std::__cxx11::string::~string(local_a58);
  std::allocator<char>::~allocator((allocator<char> *)&local_a59);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffeab0);
  std::__cxx11::string::~string(local_a30);
  std::allocator<char>::~allocator((allocator<char> *)&local_a31);
  std::__cxx11::string::~string(local_968);
  std::allocator<char>::~allocator((allocator<char> *)&local_969);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffeab0);
  std::__cxx11::string::~string(local_940);
  std::allocator<char>::~allocator((allocator<char> *)&local_941);
  std::__cxx11::string::~string(local_878);
  std::allocator<char>::~allocator((allocator<char> *)&local_879);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffeab0);
  std::__cxx11::string::~string(local_850);
  std::allocator<char>::~allocator((allocator<char> *)&local_851);
  std::__cxx11::string::~string(local_788);
  std::allocator<char>::~allocator((allocator<char> *)&local_789);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffeab0);
  std::__cxx11::string::~string(local_760);
  std::allocator<char>::~allocator((allocator<char> *)&local_761);
  std::__cxx11::string::~string(local_698);
  std::allocator<char>::~allocator((allocator<char> *)&local_699);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffeab0);
  std::__cxx11::string::~string(local_670);
  std::allocator<char>::~allocator((allocator<char> *)&local_671);
  std::__cxx11::string::~string((string *)(local_5a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_5a9);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffeab0);
  std::__cxx11::string::~string(local_580);
  std::allocator<char>::~allocator((allocator<char> *)&local_581);
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffeab0);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  std::__cxx11::string::~string(local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffeab0);
  std::__cxx11::string::~string(local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffeab0);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffeab0);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  (**(code **)*local_8)(local_8,local_a0);
  if (((local_61 & 1) == 0) &&
     ((*(float *)(local_10 + 0x6ac) != 0.0 || (NAN(*(float *)(local_10 + 0x6ac)))))) {
    *(undefined1 *)((long)local_10 + 0x343a) = 1;
  }
  else {
    if ((*(byte *)((long)local_10 + 0x3439) & 1) == 0) {
      poVar5 = std::operator<<((ostream *)(local_10 + 0x1c),"only testing");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    *(undefined1 *)((long)local_10 + 0x343a) = 0;
    if ((int)local_10[0x68f] != 0) {
      *(undefined4 *)(local_10 + 0x6ac) = 0;
    }
  }
  plVar2 = local_8;
  if ((((ulong)local_10[0x69] < 2) && ((int)local_10[0x68c] == 0)) ||
     ((*(byte *)((long)local_10 + 0x3457) & 1) != 0)) {
    *(undefined1 *)((long)local_10 + 0x3457) = 1;
  }
  else {
    *(undefined1 *)((long)local_10 + 0x3457) = 0;
  }
  std::allocator<char>::allocator();
  local_1162 = 0;
  local_1163 = 0;
  std::__cxx11::string::string(local_1138,"min_prediction",&local_1139);
  bVar3 = (**(code **)(*plVar2 + 8))(plVar2,local_1138);
  plVar2 = local_8;
  local_1472 = 1;
  if ((bVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    local_1162 = 1;
    std::__cxx11::string::string(local_1160,"max_prediction",&local_1161);
    local_1163 = 1;
    bVar3 = (**(code **)(*plVar2 + 8))(plVar2,local_1160);
    local_1472 = 1;
    if ((bVar3 & 1) == 0) {
      local_1472 = local_61;
    }
  }
  if ((local_1163 & 1) != 0) {
    std::__cxx11::string::~string(local_1160);
  }
  if ((local_1162 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1161);
  }
  std::__cxx11::string::~string(local_1138);
  std::allocator<char>::~allocator((allocator<char> *)&local_1139);
  plVar2 = local_8;
  if ((local_1472 & 1) != 0) {
    local_10[8] = (long)noop_mm;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1188,"named_labels",&local_1189);
  bVar3 = (**(code **)(*plVar2 + 8))(plVar2,local_1188);
  std::__cxx11::string::~string(local_1188);
  std::allocator<char>::~allocator((allocator<char> *)&local_1189);
  if ((bVar3 & 1) != 0) {
    pnVar6 = calloc_or_throw<namedlabels>();
    *(namedlabels **)(*local_10 + 0x70) = pnVar6;
    std::__cxx11::string::string(local_11b0,local_30);
    namedlabels::namedlabels(this,(string *)label_list);
    std::__cxx11::string::~string(local_11b0);
    if ((*(byte *)((long)local_10 + 0x3439) & 1) == 0) {
      poVar5 = std::operator<<((ostream *)(local_10 + 0x1c),"parsed ");
      uVar4 = namedlabels::getK(*(namedlabels **)(*local_10 + 0x70));
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar4);
      poVar5 = std::operator<<(poVar5," named labels");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
  }
  std::__cxx11::string::string(local_11d0,local_50);
  plVar7 = getLossFunction(all_00,&funcName->m_name,function_parameter);
  local_10[0x6a9] = (long)plVar7;
  std::__cxx11::string::~string(local_11d0);
  if (*(float *)(local_10 + 0x65) < 0.0) {
    poVar5 = std::operator<<((ostream *)(local_10 + 0x1c),
                             "l1_lambda should be nonnegative: resetting from ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(float *)(local_10 + 0x65));
    poVar5 = std::operator<<(poVar5," to 0");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    *(undefined4 *)(local_10 + 0x65) = 0;
  }
  if (*(float *)((long)local_10 + 0x32c) < 0.0) {
    poVar5 = std::operator<<((ostream *)(local_10 + 0x1c),
                             "l2_lambda should be nonnegative: resetting from ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(float *)((long)local_10 + 0x32c));
    poVar5 = std::operator<<(poVar5," to 0");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    *(undefined4 *)((long)local_10 + 0x32c) = 0;
  }
  *(uint *)(local_10 + 0x67) = (uint)(0.0 < *(float *)(local_10 + 0x65)) + (int)local_10[0x67];
  iVar1 = 0;
  if (0.0 < *(float *)((long)local_10 + 0x32c)) {
    iVar1 = 2;
  }
  *(int *)(local_10 + 0x67) = iVar1 + (int)local_10[0x67];
  if ((*(byte *)((long)local_10 + 0x3439) & 1) == 0) {
    local_1519 = 0;
    if ((int)local_10[0x67] % 2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_11f0,"bfgs",&local_11f1);
      local_1519 = (**(code **)(*local_8 + 8))(local_8,local_11f0);
      local_1519 = local_1519 ^ 0xff;
      std::__cxx11::string::~string(local_11f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_11f1);
    }
    if ((local_1519 & 1) != 0) {
      poVar5 = std::operator<<((ostream *)(local_10 + 0x1c),"using l1 regularization = ");
      pvVar8 = (void *)std::ostream::operator<<(poVar5,*(float *)(local_10 + 0x65));
      std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    }
    if (1 < (int)local_10[0x67]) {
      in_stack_ffffffffffffeab0 =
           (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::operator<<((ostream *)(local_10 + 0x1c),"using l2 regularization = ");
      pvVar8 = (void *)std::ostream::operator<<
                                 (in_stack_ffffffffffffeab0,*(float *)((long)local_10 + 0x32c));
      std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    }
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffeab0);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void parse_example_tweaks(options_i& options, vw& all)
{
  string named_labels;
  string loss_function;
  float loss_parameter = 0.0;
  size_t early_terminate_passes;
  bool test_only = false;

  option_group_definition example_options("Example options");
  example_options.add(make_option("testonly", test_only).short_name("t").help("Ignore label information and just test"))
      .add(make_option("holdout_off", all.holdout_set_off).help("no holdout data in multiple passes"))
      .add(make_option("holdout_period", all.holdout_period).default_value(10).help("holdout period for test only"))
      .add(make_option("holdout_after", all.holdout_after)
               .help("holdout after n training examples, default off (disables holdout_period)"))
      .add(
          make_option("early_terminate", early_terminate_passes)
              .default_value(3)
              .help(
                  "Specify the number of passes tolerated when holdout loss doesn't decrease before early termination"))
      .add(make_option("passes", all.numpasses).help("Number of Training Passes"))
      .add(make_option("initial_pass_length", all.pass_length).help("initial number of examples per pass"))
      .add(make_option("examples", all.max_examples).help("number of examples to parse"))
      .add(make_option("min_prediction", all.sd->min_label).help("Smallest prediction to output"))
      .add(make_option("max_prediction", all.sd->max_label).help("Largest prediction to output"))
      .add(make_option("sort_features", all.p->sort_features)
               .help("turn this on to disregard order in which features have been defined. This will lead to smaller "
                     "cache sizes"))
      .add(make_option("loss_function", loss_function)
               .default_value("squared")
               .help("Specify the loss function to be used, uses squared by default. Currently available ones are "
                     "squared, classic, hinge, logistic, quantile and poisson."))
      .add(make_option("quantile_tau", loss_parameter)
               .default_value(0.5f)
               .help("Parameter \\tau associated with Quantile loss. Defaults to 0.5"))
      .add(make_option("l1", all.l1_lambda).help("l_1 lambda"))
      .add(make_option("l2", all.l2_lambda).help("l_2 lambda"))
      .add(make_option("no_bias_regularization", all.no_bias).help("no bias in regularization"))
      .add(make_option("named_labels", named_labels)
               .keep()
               .help("use names for labels (multiclass, etc.) rather than integers, argument specified all possible "
                     "labels, comma-sep, eg \"--named_labels Noun,Verb,Adj,Punc\""));
  options.add_and_parse(example_options);

  if (test_only || all.eta == 0.)
  {
    if (!all.quiet)
      all.trace_message << "only testing" << endl;
    all.training = false;
    if (all.lda > 0)
      all.eta = 0;
  }
  else
    all.training = true;

  if ((all.numpasses > 1 || all.holdout_after > 0) && !all.holdout_set_off)
    all.holdout_set_off = false;  // holdout is on unless explicitly off
  else
    all.holdout_set_off = true;

  if (options.was_supplied("min_prediction") || options.was_supplied("max_prediction") || test_only)
    all.set_minmax = noop_mm;

  if (options.was_supplied("named_labels"))
  {
    all.sd->ldict = &calloc_or_throw<namedlabels>();
    new (all.sd->ldict) namedlabels(named_labels);
    if (!all.quiet)
      all.trace_message << "parsed " << all.sd->ldict->getK() << " named labels" << endl;
  }

  all.loss = getLossFunction(all, loss_function, loss_parameter);

  if (all.l1_lambda < 0.)
  {
    all.trace_message << "l1_lambda should be nonnegative: resetting from " << all.l1_lambda << " to 0" << endl;
    all.l1_lambda = 0.;
  }
  if (all.l2_lambda < 0.)
  {
    all.trace_message << "l2_lambda should be nonnegative: resetting from " << all.l2_lambda << " to 0" << endl;
    all.l2_lambda = 0.;
  }
  all.reg_mode += (all.l1_lambda > 0.) ? 1 : 0;
  all.reg_mode += (all.l2_lambda > 0.) ? 2 : 0;
  if (!all.quiet)
  {
    if (all.reg_mode % 2 && !options.was_supplied("bfgs"))
      all.trace_message << "using l1 regularization = " << all.l1_lambda << endl;
    if (all.reg_mode > 1)
      all.trace_message << "using l2 regularization = " << all.l2_lambda << endl;
  }
}